

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O2

string * __thiscall
pbrt::Quaternion::ToString_abi_cxx11_(string *__return_storage_ptr__,Quaternion *this)

{
  float *unaff_RBX;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ %f, %f, %f, %f ]",(char *)this,
             &(this->v).super_Tuple3<pbrt::Vector3,_float>.y,
             &(this->v).super_Tuple3<pbrt::Vector3,_float>.z,&this->w,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string Quaternion::ToString() const {
    return StringPrintf("[ %f, %f, %f, %f ]", v.x, v.y, v.z, w);
}